

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::TemplatedFetchCommitted<signed_char>(UpdateInfo *info,Vector *result)

{
  uint uVar1;
  data_ptr_t __dest;
  ulong uVar2;
  
  if (info->N != 0) {
    __dest = result->data;
    uVar1 = info->max;
    if (info->N == 0x800) {
      switchD_015ff80e::default(__dest,(void *)((long)&info[1].segment + (ulong)uVar1 * 4),0x800);
      return;
    }
    uVar2 = 0;
    do {
      __dest[*(uint *)((long)&info[1].segment + uVar2 * 4)] =
           *(data_t *)((long)&info[1].segment + uVar2 + (ulong)uVar1 * 4);
      uVar2 = uVar2 + 1;
    } while (uVar2 < info->N);
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}